

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O2

void __thiscall irr::gui::CGUISkin::setFont(CGUISkin *this,IGUIFont *font,EGUI_DEFAULT_FONT which)

{
  IGUIFont *pIVar1;
  
  if (font != (IGUIFont *)0x0 && which < EGDF_COUNT) {
    *(int *)(&font->field_0x10 + (long)font->_vptr_IGUIFont[-3]) =
         *(int *)(&font->field_0x10 + (long)font->_vptr_IGUIFont[-3]) + 1;
    pIVar1 = this->Fonts[which];
    if (pIVar1 != (IGUIFont *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&pIVar1->_vptr_IGUIFont + (long)pIVar1->_vptr_IGUIFont[-3]));
    }
    this->Fonts[which] = font;
  }
  return;
}

Assistant:

void CGUISkin::setFont(IGUIFont *font, EGUI_DEFAULT_FONT which)
{
	if ((u32)which >= EGDF_COUNT)
		return;

	if (font) {
		font->grab();
		if (Fonts[which])
			Fonts[which]->drop();

		Fonts[which] = font;
	}
}